

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

int arm_current_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    if ((env->v7m).exception != 0) {
      return 1;
    }
    return ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (env->aarch64 != 0) {
    return env->pstate >> 2 & 3;
  }
  uVar2 = env->uncached_cpsr & 0x1f;
  if (uVar2 == 0x10) {
    return 0;
  }
  if (uVar2 != 0x16) {
    if (uVar2 == 0x1a) {
      return 2;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar2 == 0x16) {
        if (((uint)uVar1 >> 0x1c & 1) == 0) {
          return 3;
        }
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
        return 3;
      }
    }
    return 1;
  }
  return 3;
}

Assistant:

static inline int arm_current_el(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        return arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[env->v7m.secure] & 1);
    }

    if (is_a64(env)) {
        return extract32(env->pstate, 2, 2);
    }

    switch (env->uncached_cpsr & 0x1f) {
    case ARM_CPU_MODE_USR:
        return 0;
    case ARM_CPU_MODE_HYP:
        return 2;
    case ARM_CPU_MODE_MON:
        return 3;
    default:
        if (arm_is_secure(env) && !arm_el_is_aa64(env, 3)) {
            /* If EL3 is 32-bit then all secure privileged modes run in
             * EL3
             */
            return 3;
        }

        return 1;
    }
}